

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution_x86::create_pipeline_int8_x86(Convolution_x86 *this,Option *opt)

{
  _func_int *p_Var1;
  float fVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  uint uVar15;
  undefined4 uVar16;
  _func_int *p_Var17;
  size_t sVar18;
  Allocator *pAVar19;
  _func_int **pp_Var20;
  int *piVar21;
  long *plVar22;
  size_t sVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  int num_input;
  int iVar26;
  ulong uVar27;
  long lVar28;
  void *pvVar29;
  ulong uVar30;
  void *pvVar31;
  ulong uVar32;
  undefined2 *puVar33;
  undefined2 *puVar34;
  int j;
  int iVar35;
  byte bVar36;
  int i_1;
  undefined2 *puVar37;
  undefined4 *puVar38;
  int i;
  int iVar39;
  long lVar40;
  long lVar41;
  int j_2;
  void *pvVar42;
  int k_2;
  Mat *pMVar43;
  ulong uVar44;
  long lVar45;
  int p;
  long lVar46;
  undefined2 *puVar47;
  bool bVar48;
  byte bVar49;
  float fVar50;
  undefined8 local_d0;
  undefined1 local_c8 [64];
  size_t local_88;
  undefined8 local_80;
  Mat *local_78;
  undefined4 local_6c;
  short sStack_68;
  undefined4 auStack_66 [11];
  ulong local_38;
  
  p_Var17 = this->_vptr_Convolution_x86[-3];
  iVar26 = *(int *)(p_Var17 + 0x2c + (long)&(this->weight_winograd23_data).data);
  iVar35 = *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
  uVar30 = (long)*(int *)(p_Var17 + 0x14 + (long)&(this->weight_winograd43_data).data) /
           (long)(iVar35 * iVar26);
  uVar15 = *(uint *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
  uVar30 = (long)((ulong)(uint)((int)uVar30 >> 0x1f) << 0x20 | uVar30 & 0xffffffff) /
           (long)(int)uVar15;
  uVar27 = uVar30 & 0xffffffff;
  bVar36 = opt->use_packing_layout;
  num_input = (int)uVar30;
  local_d0 = (void *)(long)num_input;
  if ((bool)bVar36 != true) {
    bVar48 = false;
    goto LAB_001a4d9f;
  }
  bVar48 = (uVar30 & 7) == 0;
  bVar49 = (uVar15 & 3) != 0;
  local_80 = CONCAT44(local_80._4_4_,num_input) & 0xffffffff00000007;
  if ((uVar30 & 7) == 0 && (uVar15 & 3) == 0) {
    if (((iVar35 == 1 && iVar26 == 1) &&
        (*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1)) &&
       (((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
         ((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
          (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) ||
        ((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
         ((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 2 &&
          (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 2)))))))) {
      iVar26 = 1;
      iVar35 = iVar26;
LAB_001a54b5:
      convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,uVar15,iVar26,iVar35);
    }
    else if ((((opt->use_winograd_convolution == true) &&
              (((iVar35 == 3 && (iVar26 == 3)) && (opt->use_winograd43_convolution != false)))) &&
             (((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)))) &&
            (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) {
      pMVar43 = (Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data);
      iVar26 = cpu_support_x86_xop();
      if (iVar26 == 0) {
        local_88 = 0;
        local_c8._0_8_ = (void *)0x0;
        local_c8._8_4_ = 0;
        local_c8._12_4_ = 0;
        local_c8._16_8_ = 0;
        local_c8._24_4_ = 0;
        local_c8._32_8_ = (Allocator *)0x0;
        local_c8._40_4_ = 0;
        local_c8._44_4_ = 0;
        local_c8._48_12_ = SUB1612((undefined1  [16])0x0,4);
        uVar44 = 0;
        Mat::create((Mat *)local_c8,0x24,num_input,uVar15,2,(Allocator *)0x0);
        uVar30 = 0;
        if (0 < num_input) {
          uVar30 = uVar27;
        }
        local_38 = 0;
        if (0 < (int)uVar15) {
          local_38 = (ulong)uVar15;
        }
        local_6c = num_input * 9;
        local_78 = pMVar43;
        for (; uVar44 != local_38; uVar44 = uVar44 + 1) {
          iVar26 = num_input * 9 * (int)uVar44;
          pvVar29 = pMVar43->data;
          pvVar42 = (void *)(local_c8._16_8_ * local_88 * uVar44 + local_c8._0_8_);
          for (uVar32 = 0; uVar32 != uVar30; uVar32 = uVar32 + 1) {
            lVar46 = uVar32 * 9;
            cVar3 = *(char *)((long)pvVar29 + lVar46 + iVar26);
            cVar4 = *(char *)((long)pvVar29 + lVar46 + (long)iVar26 + 1);
            cVar5 = *(char *)((long)pvVar29 + lVar46 + (long)iVar26 + 2);
            cVar6 = *(char *)((long)pvVar29 + lVar46 + (long)iVar26 + 3);
            cVar7 = *(char *)((long)pvVar29 + lVar46 + (long)iVar26 + 4);
            cVar8 = *(char *)((long)pvVar29 + lVar46 + (long)iVar26 + 5);
            cVar9 = *(char *)((long)pvVar29 + lVar46 + (long)iVar26 + 6);
            cVar10 = *(char *)((long)pvVar29 + lVar46 + (long)iVar26 + 7);
            cVar11 = *(char *)((long)pvVar29 + lVar46 + (long)iVar26 + 8);
            for (lVar46 = 4; lVar46 != 0x28; lVar46 = lVar46 + 6) {
              sVar12 = *(short *)(&UNK_004fee7c + lVar46);
              sVar13 = *(short *)(&UNK_004fee7e + lVar46);
              sVar14 = *(short *)((long)&DAT_004fee80 + lVar46);
              *(short *)((long)&local_6c + lVar46) =
                   sVar14 * cVar5 + sVar13 * cVar4 + sVar12 * cVar3;
              *(short *)((long)&local_6c + lVar46 + 2) =
                   sVar14 * cVar8 + sVar13 * cVar7 + sVar12 * cVar6;
              *(short *)((long)auStack_66 + lVar46 + -2) =
                   sVar14 * cVar11 + sVar13 * cVar10 + sVar12 * cVar9;
            }
            pvVar31 = pvVar42;
            for (lVar46 = 0; lVar46 != 6; lVar46 = lVar46 + 1) {
              sVar12 = *(short *)((long)auStack_66 + lVar46 * 6 + -2);
              uVar16 = *(undefined4 *)((long)auStack_66 + lVar46 * 6);
              puVar38 = &DAT_004fee82;
              for (lVar28 = 0; lVar28 != 6; lVar28 = lVar28 + 1) {
                *(short *)((long)pvVar31 + lVar28 * 2) =
                     (short)((uint)*puVar38 >> 0x10) * (short)((uint)uVar16 >> 0x10) +
                     (short)*puVar38 * (short)uVar16 + *(short *)((long)puVar38 + -2) * sVar12;
                puVar38 = (undefined4 *)((long)puVar38 + 6);
              }
              pvVar31 = (void *)((long)pvVar31 + 0xc);
            }
            pvVar42 = (void *)((long)pvVar42 + (long)(int)local_c8._44_4_ * local_c8._16_8_);
            pMVar43 = local_78;
          }
        }
        Mat::create(&this->weight_winograd43_data,
                    (int)((long)((ulong)(uint)(num_input >> 0x1f) << 0x20 | uVar27) / 8),0x24,
                    (int)uVar15 / 4,0x40,0x20,(Allocator *)0x0);
        iVar26 = (this->weight_winograd43_data).w;
        pvVar29 = (this->weight_winograd43_data).data;
        sVar18 = (this->weight_winograd43_data).elemsize;
        sVar23 = (this->weight_winograd43_data).cstep;
        for (uVar30 = 0; (long)(uVar30 | 3) < (long)(int)uVar15; uVar30 = uVar30 + 4) {
          lVar46 = 0;
          for (lVar28 = 0; lVar28 != 0x24; lVar28 = lVar28 + 1) {
            lVar40 = (long)pvVar29 +
                     (long)iVar26 * sVar18 * lVar28 + (uVar30 >> 2) * sVar23 * sVar18;
            puVar33 = (undefined2 *)(local_88 * local_c8._16_8_ * uVar30 + lVar46 + local_c8._0_8_);
            for (uVar44 = 0; (long)(uVar44 | 7) < (long)local_d0; uVar44 = uVar44 + 8) {
              puVar47 = puVar33;
              for (lVar41 = 0; lVar41 != 4; lVar41 = lVar41 + 1) {
                puVar37 = puVar47;
                for (lVar45 = 0; lVar45 != 0x10; lVar45 = lVar45 + 2) {
                  *(undefined2 *)(lVar40 + lVar45) = *puVar37;
                  puVar37 = (undefined2 *)
                            ((long)puVar37 + (long)(int)local_c8._44_4_ * local_c8._16_8_);
                }
                puVar47 = (undefined2 *)((long)puVar47 + local_88 * local_c8._16_8_);
                lVar40 = lVar40 + 0x10;
              }
              puVar33 = puVar33 + (long)(int)local_c8._44_4_ * local_c8._16_8_ * 4;
            }
            lVar46 = lVar46 + 2;
          }
        }
        piVar21 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
        if (piVar21 != (int *)0x0) {
          LOCK();
          *piVar21 = *piVar21 + -1;
          UNLOCK();
          if (*piVar21 == 0) {
            if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
              free((void *)local_c8._0_8_);
            }
            else {
              (*(*(_func_int ***)local_c8._32_8_)[3])();
            }
          }
        }
        goto LAB_001a4cd0;
      }
      conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop
                (pMVar43,&this->weight_winograd43_data,num_input,uVar15,opt);
    }
    else {
      if (opt->use_sgemm_convolution == true) goto LAB_001a54b5;
      convolution_transform_kernel_packed_int8_sse
                ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,num_input,uVar15,iVar26,iVar35,8,4);
    }
LAB_001a4d9f:
    bVar49 = bVar36 ^ 1;
  }
  else {
LAB_001a4cd0:
    bVar36 = bVar48;
    if (((uVar15 & 3) == 0) && ((int)local_80 != 0)) {
      p_Var17 = this->_vptr_Convolution_x86[-3];
      iVar26 = *(int *)(p_Var17 + 0x2c + (long)&(this->weight_winograd23_data).data);
      if (iVar26 == 7) {
        if ((((*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) != 7) ||
             (*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1)) ||
            (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
           ((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) != 2 ||
            (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) != 2))))
        goto LAB_001a55b0;
        iVar35 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
        iVar26 = 7;
        iVar39 = iVar26;
      }
      else if (iVar26 == 3) {
        if ((*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) != 3) ||
           ((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)))) &&
            ((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1 ||
               (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
              (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) != 2)) ||
             (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) != 2))))))
        goto LAB_001a55b0;
        iVar35 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
        iVar26 = 3;
        iVar39 = iVar26;
      }
      else if (((iVar26 == 1) &&
               (*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              ((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
                 ((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
                  (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)))) &&
                (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) ||
               ((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
                  (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
                 (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 2)) &&
                (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 2)))))) {
        iVar35 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
        iVar26 = 1;
        iVar39 = iVar26;
      }
      else {
LAB_001a55b0:
        iVar35 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
        iVar39 = *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
        if (opt->use_sgemm_convolution != true) {
          convolution_transform_kernel_packed_int8_sse
                    ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                     &this->weight_data_tm,num_input,iVar35,iVar26,iVar39,1,4);
          goto LAB_001a566e;
        }
      }
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,iVar35,iVar26,iVar39);
      goto LAB_001a566e;
    }
  }
  if ((bVar49 != 0) && (bVar48)) {
    p_Var17 = this->_vptr_Convolution_x86[-3];
    iVar26 = *(int *)(p_Var17 + 0x2c + (long)&(this->weight_winograd23_data).data);
    if (((iVar26 == 1) &&
        (*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) == 1)) &&
       (((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
         (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) ||
        ((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 2)) &&
         (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 2)))))) {
      convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,
                 *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data),1,1);
    }
    else if ((((opt->use_winograd_convolution == true) && (iVar26 == 3)) &&
             ((opt->use_winograd43_convolution != false &&
              ((*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) == 3 &&
               (*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1)))))) &&
            ((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
             ((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
              (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))))) {
      pMVar43 = &this->weight_winograd43_data;
      uVar15 = *(uint *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
      iVar26 = cpu_support_x86_xop();
      if (iVar26 == 0) {
        local_88 = 0;
        local_c8._0_8_ = (void *)0x0;
        local_c8._8_4_ = 0;
        local_c8._12_4_ = 0;
        local_c8._16_8_ = 0;
        local_c8._24_4_ = 0;
        local_c8._32_8_ = (Allocator *)0x0;
        local_c8._40_4_ = 0;
        local_c8._44_4_ = 0;
        local_c8._48_12_ = SUB1612((undefined1  [16])0x0,4);
        uVar44 = 0;
        Mat::create((Mat *)local_c8,0x24,num_input,uVar15,2,(Allocator *)0x0);
        uVar30 = 0;
        if (0 < num_input) {
          uVar30 = uVar27;
        }
        local_80 = 0;
        if (0 < (int)uVar15) {
          local_80 = (ulong)uVar15;
        }
        local_78 = pMVar43;
        for (; uVar44 != local_80; uVar44 = uVar44 + 1) {
          iVar26 = num_input * 9 * (int)uVar44;
          pvVar29 = ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data))->data;
          pvVar42 = (void *)(local_c8._16_8_ * local_88 * uVar44 + local_c8._0_8_);
          for (uVar32 = 0; uVar32 != uVar30; uVar32 = uVar32 + 1) {
            lVar46 = uVar32 * 9;
            cVar3 = *(char *)((long)pvVar29 + lVar46 + iVar26);
            cVar4 = *(char *)((long)pvVar29 + lVar46 + (long)iVar26 + 1);
            cVar5 = *(char *)((long)pvVar29 + lVar46 + (long)iVar26 + 2);
            cVar6 = *(char *)((long)pvVar29 + lVar46 + (long)iVar26 + 3);
            cVar7 = *(char *)((long)pvVar29 + lVar46 + (long)iVar26 + 4);
            cVar8 = *(char *)((long)pvVar29 + lVar46 + (long)iVar26 + 5);
            cVar9 = *(char *)((long)pvVar29 + lVar46 + (long)iVar26 + 6);
            cVar10 = *(char *)((long)pvVar29 + lVar46 + (long)iVar26 + 7);
            cVar11 = *(char *)((long)pvVar29 + lVar46 + (long)iVar26 + 8);
            for (lVar46 = 4; lVar46 != 0x28; lVar46 = lVar46 + 6) {
              sVar12 = *(short *)(&UNK_004fee7c + lVar46);
              sVar13 = *(short *)(&UNK_004fee7e + lVar46);
              sVar14 = *(short *)((long)&DAT_004fee80 + lVar46);
              *(short *)((long)&local_6c + lVar46) =
                   sVar14 * cVar5 + sVar13 * cVar4 + sVar12 * cVar3;
              *(short *)((long)&local_6c + lVar46 + 2) =
                   sVar14 * cVar8 + sVar13 * cVar7 + sVar12 * cVar6;
              *(short *)((long)auStack_66 + lVar46 + -2) =
                   sVar14 * cVar11 + sVar13 * cVar10 + sVar12 * cVar9;
            }
            pvVar31 = pvVar42;
            for (lVar46 = 0; lVar46 != 6; lVar46 = lVar46 + 1) {
              sVar12 = *(short *)((long)auStack_66 + lVar46 * 6 + -2);
              uVar16 = *(undefined4 *)((long)auStack_66 + lVar46 * 6);
              puVar38 = &DAT_004fee82;
              for (lVar28 = 0; lVar28 != 6; lVar28 = lVar28 + 1) {
                *(short *)((long)pvVar31 + lVar28 * 2) =
                     (short)((uint)*puVar38 >> 0x10) * (short)((uint)uVar16 >> 0x10) +
                     (short)*puVar38 * (short)uVar16 + *(short *)((long)puVar38 + -2) * sVar12;
                puVar38 = (undefined4 *)((long)puVar38 + 6);
              }
              pvVar31 = (void *)((long)pvVar31 + 0xc);
            }
            pvVar42 = (void *)((long)pvVar42 + (long)(int)local_c8._44_4_ * local_c8._16_8_);
            pMVar43 = local_78;
          }
        }
        Mat::create(pMVar43,num_input,0x24,((int)uVar15 / 4) * -3 + uVar15,8,4,(Allocator *)0x0);
        iVar26 = (this->weight_winograd43_data).w;
        pvVar29 = (this->weight_winograd43_data).data;
        sVar18 = (this->weight_winograd43_data).elemsize;
        sVar23 = (this->weight_winograd43_data).cstep;
        for (uVar30 = 0; (long)(uVar30 | 3) < (long)(int)uVar15; uVar30 = uVar30 + 4) {
          lVar46 = 0;
          for (lVar28 = 0; lVar28 != 0x24; lVar28 = lVar28 + 1) {
            lVar40 = (long)pvVar29 +
                     (long)iVar26 * sVar18 * lVar28 + (uVar30 >> 2) * sVar23 * sVar18;
            puVar33 = (undefined2 *)(local_88 * local_c8._16_8_ * uVar30 + lVar46 + local_c8._0_8_);
            for (uVar44 = 0; (long)(uVar44 | 7) < (long)local_d0; uVar44 = uVar44 + 8) {
              puVar47 = puVar33;
              for (lVar41 = 0; lVar41 != 4; lVar41 = lVar41 + 1) {
                puVar37 = puVar47;
                for (lVar45 = 0; lVar45 != 0x10; lVar45 = lVar45 + 2) {
                  *(undefined2 *)(lVar40 + lVar45) = *puVar37;
                  puVar37 = (undefined2 *)
                            ((long)puVar37 + (long)(int)local_c8._44_4_ * local_c8._16_8_);
                }
                puVar47 = (undefined2 *)((long)puVar47 + local_88 * local_c8._16_8_);
                lVar40 = lVar40 + 0x10;
              }
              puVar33 = puVar33 + (long)(int)local_c8._44_4_ * local_c8._16_8_ * 4;
            }
            lVar46 = lVar46 + 2;
          }
        }
        iVar26 = (this->weight_winograd43_data).w;
        pvVar29 = (this->weight_winograd43_data).data;
        sVar18 = (this->weight_winograd43_data).elemsize;
        sVar23 = (this->weight_winograd43_data).cstep;
        puVar33 = (undefined2 *)(local_c8._16_8_ * local_88 * uVar30 + local_c8._0_8_);
        for (; (long)uVar30 < (long)(int)uVar15; uVar30 = uVar30 + 1) {
          puVar47 = puVar33;
          for (lVar46 = 0; lVar46 != 0x24; lVar46 = lVar46 + 1) {
            lVar28 = (long)pvVar29 +
                     (long)iVar26 * sVar18 * lVar46 +
                     (ulong)(((uint)uVar30 & 3) + ((uint)(uVar30 >> 2) & 0x3fffffff)) *
                     sVar23 * sVar18;
            puVar37 = puVar47;
            for (uVar44 = 0; (long)(uVar44 | 7) < (long)local_d0; uVar44 = uVar44 + 8) {
              puVar34 = puVar37;
              for (lVar40 = 0; lVar40 != 0x10; lVar40 = lVar40 + 2) {
                *(undefined2 *)(lVar28 + lVar40) = *puVar34;
                puVar34 = (undefined2 *)
                          ((long)puVar34 + (long)(int)local_c8._44_4_ * local_c8._16_8_);
              }
              puVar37 = puVar37 + (long)(int)local_c8._44_4_ * local_c8._16_8_ * 4;
              lVar28 = lVar28 + 0x10;
            }
            puVar47 = puVar47 + 1;
          }
          puVar33 = (undefined2 *)((long)puVar33 + local_c8._16_8_ * local_88);
        }
        piVar21 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
        if (piVar21 != (int *)0x0) {
          LOCK();
          *piVar21 = *piVar21 + -1;
          UNLOCK();
          if (*piVar21 == 0) {
            if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
              free((void *)local_c8._0_8_);
            }
            else {
              (*(*(_func_int ***)local_c8._32_8_)[3])();
            }
          }
        }
      }
      else {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop
                  ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),pMVar43,
                   num_input,uVar15,opt);
      }
    }
    else if (opt->use_sgemm_convolution == true) {
      convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,
                 *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data),iVar26,
                 *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data));
    }
    else {
      convolution_transform_kernel_packed_int8_sse
                ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,num_input,
                 *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data),iVar26,
                 *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data),8,1);
    }
  }
  if ((bVar49 & (bVar36 ^ 1)) == 1) {
    p_Var17 = this->_vptr_Convolution_x86[-3];
    iVar26 = *(int *)(p_Var17 + 0x2c + (long)&(this->weight_winograd23_data).data);
    if (((iVar26 == 1) &&
        (*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) == 1)) &&
       (((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
         (((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) ||
        ((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 2)) &&
         (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 2)))))) {
      iVar35 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
      iVar39 = 1;
      iVar26 = iVar39;
    }
    else {
      if ((((opt->use_winograd_convolution == true) && (iVar26 == 3)) &&
          (((opt->use_winograd23_convolution != false &&
            (((*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) == 3 &&
              (*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1)) &&
             (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
           ((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))))) &&
         (0xf < num_input)) {
        iVar35 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
        if (0xf < (long)iVar35) {
          Mat::create(&this->weight_winograd23_data,0x10,num_input,iVar35,2,(Allocator *)0x0);
          for (lVar46 = 0; lVar46 != iVar35; lVar46 = lVar46 + 1) {
            lVar28 = (long)(num_input * 9 * (int)lVar46) +
                     *(long *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data);
            iVar26 = (this->weight_winograd23_data).w;
            sVar18 = (this->weight_winograd23_data).elemsize;
            pvVar29 = (void *)(sVar18 * (this->weight_winograd23_data).cstep * lVar46 +
                              (long)(this->weight_winograd23_data).data);
            for (uVar30 = 0; pvVar42 = pvVar29, uVar30 != uVar27; uVar30 = uVar30 + 1) {
              lVar40 = uVar30 * 9;
              cVar3 = *(char *)(lVar28 + lVar40);
              cVar4 = *(char *)(lVar28 + 1 + lVar40);
              cVar5 = *(char *)(lVar28 + 2 + lVar40);
              cVar6 = *(char *)(lVar28 + 3 + lVar40);
              cVar7 = *(char *)(lVar28 + 4 + lVar40);
              cVar8 = *(char *)(lVar28 + 5 + lVar40);
              cVar9 = *(char *)(lVar28 + 6 + lVar40);
              cVar10 = *(char *)(lVar28 + 7 + lVar40);
              cVar11 = *(char *)(lVar28 + 8 + lVar40);
              for (lVar40 = 4; lVar40 != 0x1c; lVar40 = lVar40 + 6) {
                sVar12 = *(short *)(&UNK_004feeac + lVar40);
                sVar13 = *(short *)(&UNK_004feeae + lVar40);
                sVar14 = *(short *)((long)&DAT_004feeb0 + lVar40);
                *(short *)((long)&local_d0 + lVar40 + 4) =
                     sVar14 * cVar5 + sVar13 * cVar4 + sVar12 * cVar3;
                *(short *)((long)&local_d0 + lVar40 + 6) =
                     sVar14 * cVar8 + sVar13 * cVar7 + sVar12 * cVar6;
                *(short *)(local_c8 + lVar40) = sVar14 * cVar11 + sVar13 * cVar10 + sVar12 * cVar9;
              }
              pvVar29 = pvVar42;
              for (lVar40 = 0; lVar40 != 4; lVar40 = lVar40 + 1) {
                sVar12 = *(short *)(local_c8 + lVar40 * 6);
                uVar16 = *(undefined4 *)(local_c8 + lVar40 * 6 + 2);
                puVar38 = &DAT_004feeb2;
                for (lVar41 = 0; lVar41 != 4; lVar41 = lVar41 + 1) {
                  *(short *)((long)pvVar29 + lVar41 * 2) =
                       (short)((uint)*puVar38 >> 0x10) * (short)((uint)uVar16 >> 0x10) +
                       (short)*puVar38 * (short)uVar16 + *(short *)((long)puVar38 + -2) * sVar12;
                  puVar38 = (undefined4 *)((long)puVar38 + 6);
                }
                pvVar29 = (void *)((long)pvVar29 + 8);
              }
              pvVar29 = (void *)((long)pvVar42 + (long)iVar26 * sVar18);
              local_d0 = pvVar42;
            }
          }
          goto LAB_001a566e;
        }
      }
      if (opt->use_sgemm_convolution != true) {
        if (p_Var17 != (_func_int *)0xfffffffffffffeb8) {
          piVar21 = *(int **)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data);
          if (piVar21 != (int *)0x0) {
            LOCK();
            *piVar21 = *piVar21 + 1;
            UNLOCK();
          }
          piVar21 = (this->weight_data_tm).refcount;
          if (piVar21 != (int *)0x0) {
            LOCK();
            *piVar21 = *piVar21 + -1;
            UNLOCK();
            if (*piVar21 == 0) {
              pAVar19 = (this->weight_data_tm).allocator;
              if (pAVar19 == (Allocator *)0x0) {
                free((this->weight_data_tm).data);
              }
              else {
                (*pAVar19->_vptr_Allocator[3])();
              }
            }
          }
          (this->weight_data_tm).cstep = 0;
          *(undefined1 (*) [16])((long)&(this->weight_data_tm).refcount + 4) = (undefined1  [16])0x0
          ;
          (this->weight_data_tm).data = (void *)0x0;
          (this->weight_data_tm).refcount = (int *)0x0;
          (this->weight_data_tm).c = 0;
          (this->weight_data_tm).dims = 0;
          (this->weight_data_tm).w = 0;
          (this->weight_data_tm).h = 0;
          (this->weight_data_tm).d = 0;
          piVar21 = *(int **)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data + 8);
          (this->weight_data_tm).data =
               *(void **)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data);
          (this->weight_data_tm).refcount = piVar21;
          (this->weight_data_tm).elemsize =
               *(size_t *)(p_Var17 + 0x38 + (long)&(this->weight_winograd63_data).data);
          (this->weight_data_tm).elempack =
               *(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd63_data).data);
          (this->weight_data_tm).allocator =
               *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var17);
          p_Var1 = (_func_int *)((long)&this->gemm + (long)p_Var17);
          uVar24 = *(undefined8 *)p_Var1;
          uVar25 = *(undefined8 *)(p_Var1 + 8);
          (this->weight_data_tm).dims = (int)uVar24;
          (this->weight_data_tm).w = (int)((ulong)uVar24 >> 0x20);
          (this->weight_data_tm).h = (int)uVar25;
          (this->weight_data_tm).d = (int)((ulong)uVar25 >> 0x20);
          (this->weight_data_tm).c = *(int *)(p_Var17 + 8 + (long)&(this->scale_in_data).data);
          (this->weight_data_tm).cstep =
               *(size_t *)(p_Var17 + 0x10 + (long)&(this->scale_in_data).data);
        }
        goto LAB_001a566e;
      }
      iVar35 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
      iVar39 = *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
    }
    convolution_im2col_sgemm_transform_kernel_int8_sse
              ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
               &this->weight_sgemm_data,num_input,iVar35,iVar26,iVar39);
  }
LAB_001a566e:
  Mat::create(&this->scale_in_data,
              *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                      (long)&(this->weight_winograd23_data).data),4,(Allocator *)0x0);
  pp_Var20 = this->_vptr_Convolution_x86;
  pvVar29 = (this->scale_in_data).data;
  for (lVar46 = 0; p_Var17 = pp_Var20[-3],
      lVar46 < *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
      lVar46 = lVar46 + 1) {
    fVar2 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var17) + lVar46 * 4);
    fVar50 = 0.0;
    if (fVar2 != 0.0) {
      fVar50 = 1.0 / (fVar2 * **(float **)(&this->field_0x238 + (long)p_Var17));
    }
    *(float *)((long)pvVar29 + lVar46 * 4) = fVar50;
  }
  if (opt->lightmode != false) {
    piVar21 = *(int **)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data);
    if (piVar21 != (int *)0x0) {
      LOCK();
      *piVar21 = *piVar21 + -1;
      UNLOCK();
      if (*piVar21 == 0) {
        plVar22 = *(long **)((long)&this->convolution_dilation1 + (long)p_Var17);
        if (plVar22 == (long *)0x0) {
          free(*(void **)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data));
        }
        else {
          (**(code **)(*plVar22 + 0x18))();
        }
      }
    }
    *(undefined8 *)(p_Var17 + 0x10 + (long)&(this->scale_in_data).data) = 0;
    *(undefined8 *)(p_Var17 + 0x34 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var17 + 0x3c + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)((long)&this->gemm + (long)p_Var17) = 0;
    *(undefined8 *)(p_Var17 + (long)&(this->scale_in_data).data) = 0;
    *(undefined4 *)(p_Var17 + 8 + (long)&(this->scale_in_data).data) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        elempack = num_input % 8 == 0 ? 8 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            // conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}